

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdsample.c
# Opt level: O3

void int_upsample(j_decompress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY input_data,
                 JSAMPARRAY *output_data_ptr)

{
  byte bVar1;
  byte bVar2;
  JSAMPARRAY input_array;
  byte *pbVar3;
  JSAMPROW __s;
  long lVar4;
  JSAMPROW pJVar5;
  long local_50;
  
  if (0 < cinfo->max_v_samp_factor) {
    input_array = *output_data_ptr;
    bVar1 = *(byte *)((long)&cinfo->upsample[10].start_pass + (long)compptr->component_index + 2);
    bVar2 = *(byte *)((long)&cinfo->upsample[9].need_context_rows + (long)compptr->component_index);
    local_50 = 0;
    lVar4 = 0;
    do {
      if ((ulong)cinfo->output_width != 0) {
        __s = input_array[lVar4];
        pJVar5 = __s + cinfo->output_width;
        pbVar3 = input_data[local_50];
        do {
          if ((ulong)bVar2 != 0) {
            memset(__s,(uint)*pbVar3,(ulong)bVar2);
            __s = __s + (ulong)(bVar2 - 1) + 1;
          }
          pbVar3 = pbVar3 + 1;
        } while (__s < pJVar5);
      }
      if (1 < bVar1) {
        jcopy_sample_rows(input_array,(int)lVar4,input_array,(int)lVar4 + 1,bVar1 - 1,
                          cinfo->output_width);
      }
      local_50 = local_50 + 1;
      lVar4 = lVar4 + (ulong)bVar1;
    } while ((int)lVar4 < cinfo->max_v_samp_factor);
  }
  return;
}

Assistant:

METHODDEF(void)
int_upsample(j_decompress_ptr cinfo, jpeg_component_info *compptr,
             JSAMPARRAY input_data, JSAMPARRAY *output_data_ptr)
{
  my_upsample_ptr upsample = (my_upsample_ptr)cinfo->upsample;
  JSAMPARRAY output_data = *output_data_ptr;
  register JSAMPROW inptr, outptr;
  register JSAMPLE invalue;
  register int h;
  JSAMPROW outend;
  int h_expand, v_expand;
  int inrow, outrow;

  h_expand = upsample->h_expand[compptr->component_index];
  v_expand = upsample->v_expand[compptr->component_index];

  inrow = outrow = 0;
  while (outrow < cinfo->max_v_samp_factor) {
    /* Generate one output row with proper horizontal expansion */
    inptr = input_data[inrow];
    outptr = output_data[outrow];
    outend = outptr + cinfo->output_width;
    while (outptr < outend) {
      invalue = *inptr++;
      for (h = h_expand; h > 0; h--) {
        *outptr++ = invalue;
      }
    }
    /* Generate any additional output rows by duplicating the first one */
    if (v_expand > 1) {
      jcopy_sample_rows(output_data, outrow, output_data, outrow + 1,
                        v_expand - 1, cinfo->output_width);
    }
    inrow++;
    outrow += v_expand;
  }
}